

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::push_back
          (vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *this,
          LightBVHNode *value)

{
  LightBVHNode *in_RSI;
  polymorphic_allocator<pbrt::LightBVHNode> *in_RDI;
  vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *unaff_retaddr;
  
  if (in_RDI[2].memoryResource == in_RDI[3].memoryResource) {
    reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<pbrt::LightBVHNode>::construct<pbrt::LightBVHNode,pbrt::LightBVHNode>
            (in_RDI,(LightBVHNode *)(in_RDI[1].memoryResource + (long)in_RDI[3].memoryResource * 4),
             in_RSI);
  in_RDI[3].memoryResource =
       (memory_resource *)((long)&(in_RDI[3].memoryResource)->_vptr_memory_resource + 1);
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }